

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float *__src;
  float *__src_00;
  float *__dest;
  Allocator *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float *ptr;
  float *pr;
  float *pf;
  int i;
  int ret1;
  int ret0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret_1;
  int ret;
  int num_directions;
  int T;
  Allocator *in_stack_fffffffffffffb68;
  Mat *in_stack_fffffffffffffb70;
  Mat *in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  Mat *in_stack_fffffffffffffb90;
  int local_3ec;
  Mat local_258;
  int local_214;
  Mat *in_stack_fffffffffffffe10;
  Mat *in_stack_fffffffffffffe18;
  Mat *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe2c;
  Mat *in_stack_fffffffffffffe30;
  Mat *in_stack_fffffffffffffe38;
  Option *in_stack_fffffffffffffe50;
  int local_4;
  
  iVar1 = *(int *)(in_RSI + 0x30);
  Mat::create(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
              (size_t)in_stack_fffffffffffffb80,(Allocator *)in_stack_fffffffffffffb78);
  bVar2 = Mat::empty(in_stack_fffffffffffffb70);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xc0) == 0) {
      Mat::channel(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      Mat::channel(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      Mat::channel(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      in_stack_fffffffffffffb68 = in_RCX;
      iVar3 = lstm(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe50);
      Mat::~Mat((Mat *)0x17811f);
      Mat::~Mat((Mat *)0x17812c);
      Mat::~Mat((Mat *)0x178139);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    if (*(int *)(in_RDI + 0xc0) == 1) {
      Mat::channel(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      Mat::channel(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      Mat::channel(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      iVar3 = lstm(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe50);
      Mat::~Mat((Mat *)0x1782af);
      Mat::~Mat((Mat *)0x1782bc);
      Mat::~Mat((Mat *)0x1782c9);
      in_stack_fffffffffffffb68 = in_RCX;
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    if (*(int *)(in_RDI + 0xc0) == 2) {
      Mat::Mat(in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               (int)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68);
      bVar2 = Mat::empty(in_stack_fffffffffffffb70);
      if (bVar2) {
        local_4 = -100;
        local_214 = 1;
      }
      else {
        Mat::Mat(in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                 (int)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffb68);
        bVar2 = Mat::empty(in_stack_fffffffffffffb70);
        iVar3 = (int)((ulong)in_stack_fffffffffffffb70 >> 0x20);
        if (bVar2) {
          local_4 = -100;
          local_214 = 1;
        }
        else {
          Mat::channel(in_stack_fffffffffffffb78,iVar3);
          Mat::channel(in_stack_fffffffffffffb78,iVar3);
          Mat::channel(in_stack_fffffffffffffb78,iVar3);
          iVar4 = lstm(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c
                       ,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       in_stack_fffffffffffffe10,in_stack_fffffffffffffe50);
          Mat::~Mat((Mat *)0x17853a);
          Mat::~Mat((Mat *)0x178547);
          Mat::~Mat((Mat *)0x178554);
          if (iVar4 == 0) {
            Mat::channel(in_stack_fffffffffffffb78,iVar3);
            Mat::channel(in_stack_fffffffffffffb78,iVar3);
            Mat::channel(in_stack_fffffffffffffb78,iVar3);
            iVar3 = lstm(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe50);
            Mat::~Mat((Mat *)0x1786bd);
            Mat::~Mat((Mat *)0x1786ca);
            Mat::~Mat((Mat *)0x1786d7);
            if (iVar3 == 0) {
              for (local_3ec = 0; local_3ec < iVar1; local_3ec = local_3ec + 1) {
                __src = Mat::row((Mat *)&stack0xfffffffffffffdf0,local_3ec);
                __src_00 = Mat::row(&local_258,local_3ec);
                __dest = Mat::row(in_RDX,local_3ec);
                memcpy(__dest,__src,(long)*(int *)(in_RDI + 0xb8) << 2);
                memcpy(__dest + *(int *)(in_RDI + 0xb8),__src_00,(long)*(int *)(in_RDI + 0xb8) << 2)
                ;
              }
              local_214 = 0;
            }
            else {
              local_214 = 1;
              local_4 = iVar3;
            }
          }
          else {
            local_214 = 1;
            local_4 = iVar4;
          }
        }
        Mat::~Mat((Mat *)0x17889d);
      }
      Mat::~Mat((Mat *)0x1788aa);
      if (local_214 != 0) {
        return local_4;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // forward
    if (direction == 0)
    {
        int ret = lstm(bottom_blob, top_blob, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, 1, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), opt);
        if (ret0 != 0)
            return ret0;

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i=0; i<T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}